

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trans_rvf.inc.c
# Opt level: O3

_Bool trans_fmv_w_x(DisasContext_conflict12 *ctx,arg_fmv_w_x *a)

{
  TCGContext_conflict11 *s;
  TCGTemp *a1;
  uintptr_t o;
  TCGv_i64 a2;
  uintptr_t o_1;
  TCGOpcode opc;
  uintptr_t o_2;
  TCGv_i64 pTVar1;
  
  if (ctx->mstatus_fs == 0) {
    return false;
  }
  if ((ctx->misa & 0x20) == 0) {
    return false;
  }
  s = ctx->uc->tcg_ctx;
  a1 = tcg_temp_new_internal_riscv64(s,TCG_TYPE_I64,false);
  pTVar1 = (TCGv_i64)((long)a1 - (long)s);
  if ((long)a->rs1 == 0) {
    opc = INDEX_op_movi_i64;
    a2 = (TCGv_i64)0x0;
  }
  else {
    if (s->cpu_gpr[a->rs1] == pTVar1) goto LAB_00c7107b;
    a2 = (TCGv_i64)((long)&s->pool_cur + (long)s->cpu_gpr[a->rs1]);
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_riscv64(s,opc,(TCGArg)a1,(TCGArg)a2);
LAB_00c7107b:
  if (s->cpu_fpr[a->rd] != pTVar1) {
    tcg_gen_op2_riscv64(s,INDEX_op_mov_i64,(TCGArg)((long)&s->pool_cur + (long)s->cpu_fpr[a->rd]),
                        (TCGArg)a1);
  }
  mark_fs_dirty(ctx);
  tcg_temp_free_internal_riscv64(s,(TCGTemp *)(pTVar1 + (long)s));
  return true;
}

Assistant:

static bool trans_fmv_w_x(DisasContext *ctx, arg_fmv_w_x *a)
{
    /* NOTE: This was FMV.S.X in an earlier version of the ISA spec! */
    REQUIRE_FPU;
    REQUIRE_EXT(ctx, RVF);
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;

    TCGv t0 = tcg_temp_new(tcg_ctx);
    gen_get_gpr(tcg_ctx, t0, a->rs1);

#if defined(TARGET_RISCV64)
    tcg_gen_mov_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], t0);
#else
    tcg_gen_extu_i32_i64(tcg_ctx, tcg_ctx->cpu_fpr[a->rd], t0);
#endif

    mark_fs_dirty(ctx);
    tcg_temp_free(tcg_ctx, t0);

    return true;
}